

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEditPrivate::cursorPositionChanged(QTextEditPrivate *this)

{
  QAccessibleTextCursorEvent *this_00;
  QTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextEdit *q;
  QAccessibleTextCursorEvent event;
  QTextCursor *this_01;
  QTextEdit *in_stack_ffffffffffffffb8;
  QObject *obj;
  QTextCursor local_30 [8];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAccessibleTextCursorEvent *)q_func(in_RDI);
  QTextEdit::cursorPositionChanged((QTextEdit *)0x6d0274);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = local_30;
  QTextEdit::textCursor(in_stack_ffffffffffffffb8);
  QTextCursor::position();
  obj = (QObject *)&local_28;
  QAccessibleTextCursorEvent::QAccessibleTextCursorEvent(this_00,obj,(int)((ulong)this_01 >> 0x20));
  QTextCursor::~QTextCursor(this_01);
  QAccessible::updateAccessibility((QAccessibleEvent *)obj);
  QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent((QAccessibleTextCursorEvent *)obj);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::cursorPositionChanged()
{
    Q_Q(QTextEdit);
    emit q->cursorPositionChanged();
#if QT_CONFIG(accessibility)
    QAccessibleTextCursorEvent event(q, q->textCursor().position());
    QAccessible::updateAccessibility(&event);
#endif
}